

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilFile.c
# Opt level: O2

void Extra_FileLineNumAdd(char *pFileName,char *pFileNameOut)

{
  FILE *__stream;
  FILE *__stream_00;
  char *pcVar1;
  size_t sVar2;
  ulong uVar3;
  char Buffer [1000];
  undefined8 local_420;
  char local_418 [1000];
  
  __stream = fopen(pFileName,"rb");
  if (__stream != (FILE *)0x0) {
    __stream_00 = fopen(pFileNameOut,"wb");
    if (__stream_00 != (FILE *)0x0) {
      uVar3 = 0;
      local_420 = pFileNameOut;
      while (pcVar1 = fgets(local_418,1000,__stream), pcVar1 != (char *)0x0) {
        sVar2 = strlen(local_418);
        sprintf(local_418 + (sVar2 - 2),"%03d\n%c",uVar3,0);
        fputs(local_418,__stream_00);
        uVar3 = (ulong)((int)uVar3 + 1);
      }
      fclose(__stream);
      fclose(__stream_00);
      printf("The resulting file is \"%s\".\n",local_420);
      return;
    }
    fclose(__stream);
    pFileName = pFileNameOut;
  }
  printf("Extra_FileLineNumAdd(): Cannot open file \"%s\".\n",pFileName);
  return;
}

Assistant:

void Extra_FileLineNumAdd( char * pFileName, char * pFileNameOut )
{
    char Buffer[1000];
    FILE * pFile;
    FILE * pFile2;
    int iLine;
    pFile = fopen( pFileName, "rb" );
    if ( pFile == NULL )
    {
        printf( "Extra_FileLineNumAdd(): Cannot open file \"%s\".\n", pFileName );
        return;
    }
    pFile2 = fopen( pFileNameOut, "wb" );
    if ( pFile2 == NULL )
    {
        fclose( pFile );
        printf( "Extra_FileLineNumAdd(): Cannot open file \"%s\".\n", pFileNameOut );
        return;
    }
    for ( iLine = 0; fgets( Buffer, 1000, pFile ); iLine++ )
    {
        sprintf( Buffer + strlen(Buffer) - 2, "%03d\n%c", iLine, 0 );
        fputs( Buffer, pFile2 );
    }
    fclose( pFile );
    fclose( pFile2 );
    // report the result
    printf( "The resulting file is \"%s\".\n", pFileNameOut );
}